

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_compress_destSize_generic
              (void *ctx,char *src,char *dst,int *srcSizePtr,int targetDstSize,tableType_t tableType
              )

{
  int iVar1;
  U32 UVar2;
  U32 UVar3;
  U32 UVar4;
  uint uVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  bool bVar8;
  ulong local_e8;
  size_t accumulator;
  size_t lastRunSize;
  size_t matchLength;
  uint len;
  uint litLength;
  U32 h;
  uint searchMatchNb;
  uint step;
  BYTE *forwardIp;
  BYTE *token;
  BYTE *match;
  U32 forwardH;
  BYTE *oMaxSeq;
  BYTE *oMaxMatch;
  BYTE *oMaxLit;
  BYTE *oend;
  BYTE *op;
  BYTE *matchlimit;
  BYTE *mflimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *ip;
  tableType_t tableType_local;
  int targetDstSize_local;
  int *srcSizePtr_local;
  char *dst_local;
  char *src_local;
  void *ctx_local;
  
  iVar1 = *srcSizePtr;
  pBVar6 = (BYTE *)(dst + targetDstSize);
  if (targetDstSize < 1) {
    ctx_local._4_4_ = 0;
  }
  else if ((uint)*srcSizePtr < 0x7e000001) {
    if ((tableType == byU16) && (0x1000a < *srcSizePtr)) {
      ctx_local._4_4_ = 0;
    }
    else {
      oend = (BYTE *)dst;
      iend = (BYTE *)src;
      if (0xc < *srcSizePtr) {
        *srcSizePtr = 0;
        LZ4_putPosition((BYTE *)src,ctx,tableType,(BYTE *)src);
        base = (BYTE *)(src + 1);
        match._4_4_ = LZ4_hashPosition(base,tableType);
        while( true ) {
          _searchMatchNb = base;
          h = 1;
          litLength = 0x40;
          do {
            base = _searchMatchNb;
            pBVar7 = _searchMatchNb + h;
            h = litLength >> 6;
            if (src + (long)iVar1 + -0xc < pBVar7) goto LAB_0026a731;
            token = LZ4_getPositionOnHash(match._4_4_,ctx,tableType,(BYTE *)src);
            UVar2 = LZ4_hashPosition(pBVar7,tableType);
            LZ4_putPositionOnHash(_searchMatchNb,match._4_4_,ctx,tableType,(BYTE *)src);
            if ((tableType == byU16) || (bVar8 = true, _searchMatchNb <= token + 0xffff)) {
              UVar3 = LZ4_read32(token);
              UVar4 = LZ4_read32(_searchMatchNb);
              bVar8 = UVar3 != UVar4;
            }
            litLength = litLength + 1;
            _searchMatchNb = pBVar7;
            match._4_4_ = UVar2;
          } while (bVar8);
          while( true ) {
            bVar8 = false;
            if ((iend < base) && (bVar8 = false, src < token)) {
              bVar8 = base[-1] == token[-1];
            }
            if (!bVar8) break;
            base = base + -1;
            token = token + -1;
          }
          uVar5 = (int)base - (int)iend;
          pBVar7 = oend + 1;
          forwardIp = oend;
          if (dst + (long)targetDstSize + -0xb <
              pBVar7 + (ulong)uVar5 + (ulong)(uVar5 + 0xf0) / 0xff) break;
          if (uVar5 < 0xf) {
            *oend = (char)uVar5 * '\x10';
            oend = pBVar7;
          }
          else {
            *oend = 0xf0;
            oend = pBVar7;
            for (matchLength._4_4_ = uVar5 - 0xf; 0xfe < matchLength._4_4_;
                matchLength._4_4_ = matchLength._4_4_ - 0xff) {
              *oend = 0xff;
              oend = oend + 1;
            }
            *oend = (BYTE)matchLength._4_4_;
            oend = oend + 1;
          }
          LZ4_wildCopy(oend,iend,oend + uVar5);
          oend = oend + uVar5;
          while( true ) {
            LZ4_writeLE16(oend,(short)base - (short)token);
            oend = oend + 2;
            uVar5 = LZ4_count(base + 4,token + 4,(BYTE *)(src + (long)iVar1 + -5));
            lastRunSize = (size_t)uVar5;
            if (dst + (long)targetDstSize + -6 < oend + (lastRunSize + 0xf0) / 0xff) {
              lastRunSize = ((long)(dst + (long)targetDstSize + -6) - (long)oend) * 0xff + 0xe;
            }
            iend = base + lastRunSize + 4;
            if (lastRunSize < 0xf) {
              *forwardIp = *forwardIp + (char)lastRunSize;
            }
            else {
              *forwardIp = *forwardIp + '\x0f';
              lastRunSize = lastRunSize - 0xf;
              while (0xfe < lastRunSize) {
                lastRunSize = lastRunSize - 0xff;
                *oend = 0xff;
                oend = oend + 1;
              }
              *oend = (BYTE)lastRunSize;
              oend = oend + 1;
            }
            if ((src + (long)iVar1 + -0xc < iend) || (dst + (long)targetDstSize + -0xc < oend))
            goto LAB_0026a731;
            LZ4_putPosition(iend + -2,ctx,tableType,(BYTE *)src);
            token = LZ4_getPosition(iend,ctx,tableType,(BYTE *)src);
            LZ4_putPosition(iend,ctx,tableType,(BYTE *)src);
            if (token + 0xffff < iend) break;
            UVar2 = LZ4_read32(token);
            UVar3 = LZ4_read32(iend);
            if (UVar2 != UVar3) break;
            forwardIp = oend;
            *oend = '\0';
            oend = oend + 1;
            base = iend;
          }
          base = iend + 1;
          match._4_4_ = LZ4_hashPosition(base,tableType);
        }
      }
LAB_0026a731:
      accumulator = (size_t)(src + ((long)iVar1 - (long)iend));
      if (pBVar6 < oend + (long)(accumulator + (ulong)(accumulator + 0xf0) / 0xff + 1)) {
        accumulator = (size_t)(pBVar6 + ((-1 - (long)oend) -
                                        (ulong)(pBVar6 + (0xef - (long)oend)) / 0xff));
      }
      if (accumulator < 0xf) {
        *oend = (BYTE)(accumulator << 4);
        oend = oend + 1;
      }
      else {
        local_e8 = accumulator - 0xf;
        *oend = 0xf0;
        pBVar6 = oend;
        for (; oend = pBVar6 + 1, 0xfe < local_e8; local_e8 = local_e8 - 0xff) {
          *oend = 0xff;
          pBVar6 = oend;
        }
        *oend = (BYTE)local_e8;
        oend = pBVar6 + 2;
      }
      memcpy(oend,iend,accumulator);
      *srcSizePtr = ((int)iend + (int)accumulator) - (int)src;
      ctx_local._4_4_ = ((int)accumulator + (int)oend) - (int)dst;
    }
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int LZ4_compress_destSize_generic(
                       void* const ctx,
                 const char* const src,
                       char* const dst,
                       int*  const srcSizePtr,
                 const int targetDstSize,
                 const tableType_t tableType)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* base = (const BYTE*) src;
    const BYTE* lowLimit = (const BYTE*) src;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + *srcSizePtr;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = iend - LASTLITERALS;

    BYTE* op = (BYTE*) dst;
    BYTE* const oend = op + targetDstSize;
    BYTE* const oMaxLit = op + targetDstSize - 2 /* offset */ - 8 /* because 8+MINMATCH==MFLIMIT */ - 1 /* token */;
    BYTE* const oMaxMatch = op + targetDstSize - (LASTLITERALS + 1 /* token */);
    BYTE* const oMaxSeq = oMaxLit - 1 /* token */;

    U32 forwardH;


    /* Init conditions */
    if (targetDstSize < 1) return 0;                                     /* Impossible to store anything */
    if ((U32)*srcSizePtr > (U32)LZ4_MAX_INPUT_SIZE) return 0;            /* Unsupported input size, too large (or negative) */
    if ((tableType == byU16) && (*srcSizePtr>=LZ4_64Klimit)) return 0;   /* Size too large (not within 64K limit) */
    if (*srcSizePtr<LZ4_minLength) goto _last_literals;                  /* Input too small, no compression (all literals) */

    /* First Byte */
    *srcSizePtr = 0;
    LZ4_putPosition(ip, ctx, tableType, base);
    ip++; forwardH = LZ4_hashPosition(ip, tableType);

    /* Main Loop */
    for ( ; ; )
    {
        const BYTE* match;
        BYTE* token;
        {
            const BYTE* forwardIp = ip;
            unsigned step = 1;
            unsigned searchMatchNb = 1 << LZ4_skipTrigger;

            /* Find a match */
            do {
                U32 h = forwardH;
                ip = forwardIp;
                forwardIp += step;
                step = (searchMatchNb++ >> LZ4_skipTrigger);

                if (unlikely(forwardIp > mflimit))
                    goto _last_literals;

                match = LZ4_getPositionOnHash(h, ctx, tableType, base);
                forwardH = LZ4_hashPosition(forwardIp, tableType);
                LZ4_putPositionOnHash(ip, h, ctx, tableType, base);

            } while ( ((tableType==byU16) ? 0 : (match + MAX_DISTANCE < ip))
                || (LZ4_read32(match) != LZ4_read32(ip)) );
        }

        /* Catch up */
        while ((ip>anchor) && (match > lowLimit) && (unlikely(ip[-1]==match[-1]))) { ip--; match--; }

        {
            /* Encode Literal length */
            unsigned litLength = (unsigned)(ip - anchor);
            token = op++;
            if (op + ((litLength+240)/255) + litLength > oMaxLit)
            {
                /* Not enough space for a last match */
                op--;
                goto _last_literals;
            }
            if (litLength>=RUN_MASK)
            {
                unsigned len = litLength - RUN_MASK;
                *token=(RUN_MASK<<ML_BITS);
                for(; len >= 255 ; len-=255) *op++ = 255;
                *op++ = (BYTE)len;
            }
            else *token = (BYTE)(litLength<<ML_BITS);

            /* Copy Literals */
            LZ4_wildCopy(op, anchor, op+litLength);
            op += litLength;
        }

_next_match:
        /* Encode Offset */
        LZ4_writeLE16(op, (U16)(ip-match)); op+=2;

        /* Encode MatchLength */
        {
            size_t matchLength;

            matchLength = LZ4_count(ip+MINMATCH, match+MINMATCH, matchlimit);

            if (op + ((matchLength+240)/255) > oMaxMatch)
            {
                /* Match description too long : reduce it */
                matchLength = (15-1) + (oMaxMatch-op) * 255;
            }
            //printf("offset %5i, matchLength%5i \n", (int)(ip-match), matchLength + MINMATCH);
            ip += MINMATCH + matchLength;

            if (matchLength>=ML_MASK)
            {
                *token += ML_MASK;
                matchLength -= ML_MASK;
                while (matchLength >= 255) { matchLength-=255; *op++ = 255; }
                *op++ = (BYTE)matchLength;
            }
            else *token += (BYTE)(matchLength);
        }

        anchor = ip;

        /* Test end of block */
        if (ip > mflimit) break;
        if (op > oMaxSeq) break;

        /* Fill table */
        LZ4_putPosition(ip-2, ctx, tableType, base);

        /* Test next position */
        match = LZ4_getPosition(ip, ctx, tableType, base);
        LZ4_putPosition(ip, ctx, tableType, base);
        if ( (match+MAX_DISTANCE>=ip)
            && (LZ4_read32(match)==LZ4_read32(ip)) )
        { token=op++; *token=0; goto _next_match; }

        /* Prepare next loop */
        forwardH = LZ4_hashPosition(++ip, tableType);
    }

_last_literals:
    /* Encode Last Literals */
    {
        size_t lastRunSize = (size_t)(iend - anchor);
        if (op + 1 /* token */ + ((lastRunSize+240)/255) /* litLength */ + lastRunSize /* literals */ > oend)
        {
            /* adapt lastRunSize to fill 'dst' */
            lastRunSize  = (oend-op) - 1;
            lastRunSize -= (lastRunSize+240)/255;
        }
        ip = anchor + lastRunSize;

        if (lastRunSize >= RUN_MASK)
        {
            size_t accumulator = lastRunSize - RUN_MASK;
            *op++ = RUN_MASK << ML_BITS;
            for(; accumulator >= 255 ; accumulator-=255) *op++ = 255;
            *op++ = (BYTE) accumulator;
        }
        else
        {
            *op++ = (BYTE)(lastRunSize<<ML_BITS);
        }
        memcpy(op, anchor, lastRunSize);
        op += lastRunSize;
    }

    /* End */
    *srcSizePtr = (int) (((const char*)ip)-src);
    return (int) (((char*)op)-dst);
}